

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing_portal.h
# Opt level: O3

TestingPortal * tcmalloc::TestingPortal::Get(void)

{
  int iVar1;
  anon_class_1_0_00000001 local_11;
  
  if (Get()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&Get()::instance);
    if (iVar1 != 0) {
      Get::instance = Get::anon_class_1_0_00000001::operator()(&local_11);
      __cxa_guard_release(&Get()::instance);
    }
  }
  return Get::instance;
}

Assistant:

static TestingPortal* Get() {
    static TestingPortal* instance = ([] () {
      struct {
        TestingPortal* ptr = nullptr;
        size_t v = 0;
      } s;
      bool ok = MallocExtension::instance()->GetNumericProperty(kMagic, &s.v);
      if (!ok || s.ptr == nullptr) {
        abort();
      }
      return s.ptr;
    })();

    return instance;
  }